

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O0

QRect __thiscall QWidgetEffectSourcePrivate::deviceRect(QWidgetEffectSourcePrivate *this)

{
  QRect QVar1;
  QWidget *in_stack_00000008;
  
  QWidget::window((QWidget *)this);
  QVar1 = QWidget::rect(in_stack_00000008);
  return QVar1;
}

Assistant:

QRect deviceRect() const override
    { return m_widget->window()->rect(); }